

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true> __thiscall
duckdb::Connection::TableInfo(Connection *this,string *table_name)

{
  ClientContext *database_name;
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,anon_var_dwarf_4ed193b + 9);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"main","");
  database_name =
       shared_ptr<duckdb::ClientContext,_true>::operator->
                 ((shared_ptr<duckdb::ClientContext,_true> *)table_name);
  ClientContext::TableInfo((ClientContext *)this,(string *)database_name,&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>)
         (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>)this;
}

Assistant:

unique_ptr<TableDescription> Connection::TableInfo(const string &table_name) {
	return TableInfo(INVALID_CATALOG, DEFAULT_SCHEMA, table_name);
}